

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O0

void __thiscall Buffer::Buffer(Buffer *this,uchar *buf,size_t size)

{
  Members *this_00;
  size_t size_local;
  uchar *buf_local;
  Buffer *this_local;
  
  this_00 = (Members *)operator_new(0x38);
  Members::Members(this_00,size,buf,false);
  std::unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>>::
  unique_ptr<std::default_delete<Buffer::Members>,void>
            ((unique_ptr<Buffer::Members,std::default_delete<Buffer::Members>> *)this,this_00);
  return;
}

Assistant:

Buffer::Buffer(unsigned char* buf, size_t size) :
    m(new Members(size, buf, false))
{
}